

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_true,_false>::append_edge_(DaTrie<false,_true,_false> *this,Query *query)

{
  pointer pBVar1;
  char *pcVar2;
  pointer pNVar3;
  ulong uVar4;
  uint uVar5;
  uint node_pos;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pBVar1;
  if ((ulong)((long)uVar4 >> 3) <= (ulong)query->node_pos_) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x205,
                  "void ddd::DaTrie<false, true, false>::append_edge_(Query &) [WithBLM = false, WithNLM = true, Prefix = false]"
                 );
  }
  if ((long)pBVar1[query->node_pos_] < 0) {
    uVar5 = this->head_pos_;
    if (this->head_pos_ == 0xffffffff) {
      uVar5 = (uint)(uVar4 >> 3);
    }
    uVar5 = uVar5 ^ (byte)query->key_[query->pos_];
    node_pos = (byte)query->key_[query->pos_] ^ uVar5;
    fix_(this,node_pos,&this->blocks_);
    *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
              super__Vector_impl_data._M_start + query->node_pos_) = uVar5 & 0x7fffffff;
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[node_pos] =
         (Bc)((ulong)pBVar1[node_pos] & 0x80000000ffffffff |
             (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
    pcVar2 = query->key_;
    uVar5 = query->pos_;
    pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar3[query->node_pos_].child = pcVar2[uVar5];
    pNVar3[node_pos].sib = pcVar2[uVar5];
    query->node_pos_ = node_pos;
    query->pos_ = uVar5 + 1;
    query->is_finished_ = pcVar2[uVar5] == '\0';
    return;
  }
  __assert_fail("bc_[query.node_pos()].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x206,
                "void ddd::DaTrie<false, true, false>::append_edge_(Query &) [WithBLM = false, WithNLM = true, Prefix = false]"
               );
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }